

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview_p.h
# Opt level: O0

int __thiscall QListViewPrivate::flipX(QListViewPrivate *this,int x)

{
  int *piVar1;
  int in_ESI;
  QListViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = QWidget::width((QWidget *)0x88c4b5);
  contentsSize(in_RDI);
  local_10 = QSize::width((QSize *)0x88c4d2);
  piVar1 = qMax<int>(&local_c,&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return *piVar1 - in_ESI;
  }
  __stack_chk_fail();
}

Assistant:

inline int flipX(int x) const
        { return qMax(viewport->width(), contentsSize().width()) - x; }